

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

void sexp_bignum_split(sexp ctx,sexp a,sexp_uint_t k,sexp_conflict *lo,sexp_conflict *hi)

{
  sexp_conflict psVar1;
  sexp_uint_t sVar2;
  sexp psVar3;
  sexp *ppsVar4;
  sexp_uint_t sVar5;
  
  sVar2 = sexp_bignum_hi(a);
  psVar3 = sexp_make_bignum(ctx,k);
  *lo = psVar3;
  psVar3 = sexp_make_bignum(ctx,(sVar2 - k) + 1);
  *hi = psVar3;
  psVar1 = *lo;
  for (sVar5 = 0; k != sVar5; sVar5 = sVar5 + 1) {
    *(undefined8 *)((long)&psVar1->value + sVar5 * 8 + 0x10) =
         *(undefined8 *)((long)&a->value + sVar5 * 8 + 0x10);
  }
  ppsVar4 = &(psVar3->value).type.slots;
  for (; k < sVar2; k = k + 1) {
    *ppsVar4 = *(sexp *)((long)&a->value + k * 8 + 0x10);
    ppsVar4 = ppsVar4 + 1;
  }
  return;
}

Assistant:

static void sexp_bignum_split (sexp ctx, sexp a, sexp_uint_t k, sexp* lo, sexp* hi) {
  sexp_uint_t alen=sexp_bignum_hi(a), i, *adata=sexp_bignum_data(a),
    *lodata, *hidata;
  *lo = sexp_make_bignum(ctx, k);        /* must be gc protected by caller */
  *hi = sexp_make_bignum(ctx, alen-k+1);
  lodata = sexp_bignum_data(*lo);
  hidata = sexp_bignum_data(*hi);
  for (i=0; i<k; i++)                    /* split into a[0..k-1], a[k..] */
    lodata[i] = adata[i];
  for (i=k; i<alen; i++)
    hidata[i-k] = adata[i];
}